

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeDrawList(ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImDrawVert *pIVar3;
  ImGuiTable *table;
  ImGuiContext *pIVar4;
  unsigned_short *puVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  ImGuiWindow *window_1;
  ImDrawList *this;
  long lVar9;
  bool show_mesh;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  ImVec4 *buf_00;
  int iVar13;
  long lVar14;
  ImDrawCmd *pIVar15;
  ulong uVar16;
  float fVar17;
  double dVar18;
  undefined1 auVar19 [16];
  ImGuiListClipper clipper;
  ImVec2 triangle_1 [3];
  char buf [300];
  ImGuiListClipper local_1f8;
  ImGuiContext *local_1d0;
  ImDrawCmd *local_1c8;
  unsigned_short *local_1c0;
  ImDrawList *local_1b8;
  long local_1b0;
  ulong local_1a8;
  ImVec2 local_1a0;
  ImVec2 local_198 [4];
  undefined1 local_178 [16];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  iVar13 = (draw_list->CmdBuffer).Size;
  lVar14 = (long)iVar13;
  if ((0 < lVar14) && (pIVar15 = (draw_list->CmdBuffer).Data, pIVar15[lVar14 + -1].ElemCount == 0))
  {
    iVar13 = iVar13 - (uint)(pIVar15[lVar14 + -1].UserCallback == (ImDrawCallback)0x0);
  }
  local_1d0 = GImGui;
  pcVar10 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar10 = draw_list->_OwnerName;
  }
  bVar6 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar10,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar13);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar6) {
      return;
    }
  }
  else {
    this = GetForegroundDrawList();
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar6) {
        return;
      }
    }
    else {
      bVar7 = IsItemHovered(0);
      if (bVar7) {
        auVar19._0_4_ = (window->Pos).x + (window->Size).x;
        auVar19._4_4_ = (window->Pos).y + (window->Size).y;
        auVar19._8_8_ = 0;
        local_168[0]._0_8_ = vmovlps_avx(auVar19);
        ImDrawList::AddRect(this,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
      }
      if (!bVar6) {
        return;
      }
      if (window->WasActive == false) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
    }
    if (0 < iVar13) {
      pIVar15 = (draw_list->CmdBuffer).Data;
      local_178._8_4_ = 0x7fffffff;
      local_178._0_8_ = 0x7fffffff7fffffff;
      local_178._12_4_ = 0x7fffffff;
      local_1b0 = (long)iVar13 * 0x38;
      local_1b8 = draw_list;
      do {
        if (pIVar15->UserCallback == (ImDrawCallback)0x0) {
          ImFormatString((char *)local_168,300,
                         "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         (double)(pIVar15->ClipRect).x,(double)(pIVar15->ClipRect).y,
                         (double)(pIVar15->ClipRect).z,(double)(pIVar15->ClipRect).w,
                         (ulong)pIVar15->ElemCount / 3,pIVar15->TextureId);
          bVar6 = TreeNode((void *)(((long)pIVar15 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                   0x6db6db6db6db6db7),"%s",local_168);
          bVar7 = IsItemHovered(0);
          if (bVar7) {
            if ((local_1d0->DebugMetricsConfig).ShowDrawCmdMesh == false) {
              if ((this != (ImDrawList *)0x0) &&
                 ((local_1d0->DebugMetricsConfig).ShowDrawCmdBoundingBoxes != false)) {
                show_mesh = false;
                bVar7 = true;
                goto LAB_00162d49;
              }
            }
            else if (this != (ImDrawList *)0x0) {
              bVar7 = (local_1d0->DebugMetricsConfig).ShowDrawCmdBoundingBoxes;
              show_mesh = true;
LAB_00162d49:
              DebugNodeDrawCmdShowMeshAndBoundingBox(this,draw_list,pIVar15,show_mesh,bVar7);
            }
          }
          if (bVar6) {
            if ((draw_list->IdxBuffer).Size < 1) {
              local_1c0 = (unsigned_short *)0x0;
            }
            else {
              local_1c0 = (draw_list->IdxBuffer).Data;
            }
            uVar1 = pIVar15->VtxOffset;
            uVar11 = pIVar15->IdxOffset;
            pIVar3 = (draw_list->VtxBuffer).Data;
            uVar8 = pIVar15->ElemCount + uVar11;
            dVar18 = 0.0;
            if (uVar11 < uVar8) {
              fVar17 = 0.0;
              do {
                local_1f8.DisplayStart = 0;
                local_1f8.DisplayEnd = 0;
                local_1f8.ItemsCount = 0;
                local_1f8.StepNo = 0;
                local_1f8.ItemsFrozen = 0;
                local_1f8.ItemsHeight = 0.0;
                lVar14 = 0;
                do {
                  uVar12 = (uint)((ulong)uVar11 + lVar14);
                  if (local_1c0 != (unsigned_short *)0x0) {
                    uVar12 = (uint)local_1c0[(ulong)uVar11 + lVar14 & 0xffffffff];
                  }
                  *(ImVec2 *)(&local_1f8.DisplayStart + lVar14 * 2) =
                       pIVar3[(ulong)uVar1 + (ulong)uVar12].pos;
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                auVar19 = vandps_avx(ZEXT416((uint)(((float)local_1f8.DisplayEnd -
                                                    (float)local_1f8.StepNo) *
                                                    (float)local_1f8.ItemsFrozen +
                                                   ((float)local_1f8.StepNo - local_1f8.ItemsHeight)
                                                   * (float)local_1f8.DisplayStart +
                                                   (local_1f8.ItemsHeight -
                                                   (float)local_1f8.DisplayEnd) *
                                                   (float)local_1f8.ItemsCount)),local_178);
                fVar17 = fVar17 + auVar19._0_4_ * 0.5;
                uVar11 = uVar11 + 3;
              } while (uVar11 < uVar8);
              dVar18 = (double)fVar17;
            }
            ImFormatString((char *)local_168,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           dVar18);
            local_1f8.DisplayStart = 0;
            local_1f8.DisplayEnd = 0;
            Selectable((char *)local_168,false,0,(ImVec2 *)&local_1f8);
            bVar6 = IsItemHovered(0);
            if (this != (ImDrawList *)0x0 && bVar6) {
              DebugNodeDrawCmdShowMeshAndBoundingBox(this,draw_list,pIVar15,true,false);
            }
            ImGuiListClipper::ImGuiListClipper(&local_1f8);
            uVar11 = pIVar15->ElemCount;
            pIVar2 = GImGui->CurrentWindow;
            table = GImGui->CurrentTable;
            local_1c8 = pIVar15;
            if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
              TableEndRow(table);
            }
            local_1f8.StartPosY = (pIVar2->DC).CursorPos.y;
            local_1f8.ItemsHeight = -1.0;
            local_1f8.ItemsCount = uVar11 / 3;
            local_1f8.StepNo = 0;
            local_1f8.ItemsFrozen = 0;
            local_1f8.DisplayStart = -1;
            local_1f8.DisplayEnd = 0;
            while (bVar6 = ImGuiListClipper::Step(&local_1f8), bVar6) {
              if (local_1f8.DisplayStart < local_1f8.DisplayEnd) {
                uVar16 = (ulong)(local_1f8.DisplayStart * 3 + local_1c8->IdxOffset);
                uVar11 = local_1f8.DisplayStart;
                do {
                  puVar5 = local_1c0;
                  local_1a8 = (ulong)uVar11;
                  local_198[0].x = 0.0;
                  local_198[0].y = 0.0;
                  local_198[1].x = 0.0;
                  local_198[1].y = 0.0;
                  local_198[2].x = 0.0;
                  local_198[2].y = 0.0;
                  lVar14 = 0;
                  buf_00 = local_168;
                  do {
                    if (local_1c0 == (unsigned_short *)0x0) {
                      uVar11 = (int)uVar16 + (int)lVar14;
                    }
                    else {
                      uVar11 = (uint)puVar5[(int)uVar16 + lVar14];
                    }
                    lVar9 = (long)(int)uVar11;
                    local_198[lVar14] = pIVar3[(ulong)uVar1 + lVar9].pos;
                    pcVar10 = "     ";
                    if (lVar14 == 0) {
                      pcVar10 = "Vert:";
                    }
                    iVar13 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                            "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                            ,(double)pIVar3[(ulong)uVar1 + lVar9].pos.x,
                                            (double)pIVar3[(ulong)uVar1 + lVar9].pos.y,
                                            (double)pIVar3[(ulong)uVar1 + lVar9].uv.x,
                                            (double)pIVar3[(ulong)uVar1 + lVar9].uv.y,pcVar10,
                                            (uVar16 & 0xffffffff) + lVar14,
                                            (ulong)pIVar3[(ulong)uVar1 + lVar9].col);
                    buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar13);
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 3);
                  local_1a0.x = 0.0;
                  local_1a0.y = 0.0;
                  Selectable((char *)local_168,false,0,&local_1a0);
                  if ((this != (ImDrawList *)0x0) && (bVar6 = IsItemHovered(0), bVar6)) {
                    uVar11 = this->Flags;
                    this->Flags = uVar11 & 0xfffffffe;
                    ImDrawList::AddPolyline(this,local_198,3,0xff00ffff,true,1.0);
                    this->Flags = uVar11;
                  }
                  uVar16 = (uVar16 & 0xffffffff) + 3;
                  uVar11 = (int)local_1a8 + 1;
                } while ((int)uVar11 < local_1f8.DisplayEnd);
              }
            }
            TreePop();
            ImGuiListClipper::~ImGuiListClipper(&local_1f8);
            pIVar15 = local_1c8;
            draw_list = local_1b8;
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar15->UserCallback,pIVar15->UserCallbackData);
        }
        pIVar15 = pIVar15 + 1;
      } while (pIVar15 < (ImDrawCmd *)
                         ((long)&(((draw_list->CmdBuffer).Data)->ClipRect).x + local_1b0));
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    if (window && IsItemHovered())
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}